

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintNestedDescriptors
          (Generator *this,Descriptor *containing_descriptor,StripPrintDescriptor print_mode)

{
  int iVar1;
  Descriptor *pDVar2;
  int local_24;
  int local_20;
  int i_1;
  int i;
  StripPrintDescriptor print_mode_local;
  Descriptor *containing_descriptor_local;
  Generator *this_local;
  
  if (print_mode == kCreate) {
    for (local_20 = 0; iVar1 = Descriptor::nested_type_count(containing_descriptor),
        local_20 < iVar1; local_20 = local_20 + 1) {
      pDVar2 = Descriptor::nested_type(containing_descriptor,local_20);
      PrintCreateDescriptor(this,pDVar2);
    }
  }
  else {
    for (local_24 = 0; iVar1 = Descriptor::nested_type_count(containing_descriptor),
        local_24 < iVar1; local_24 = local_24 + 1) {
      pDVar2 = Descriptor::nested_type(containing_descriptor,local_24);
      PrintFindDescriptor(this,pDVar2);
    }
  }
  return;
}

Assistant:

void Generator::PrintNestedDescriptors(const Descriptor& containing_descriptor,
                                       StripPrintDescriptor print_mode) const {
  if (print_mode == StripPrintDescriptor::kCreate) {
    for (int i = 0; i < containing_descriptor.nested_type_count(); ++i) {
      PrintCreateDescriptor(*containing_descriptor.nested_type(i));
    }
  } else {
    for (int i = 0; i < containing_descriptor.nested_type_count(); ++i) {
      PrintFindDescriptor(*containing_descriptor.nested_type(i));
    }
  }
}